

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O1

void ncnn::resize_bilinear_c1
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  float fVar4;
  short *psVar5;
  int iVar6;
  int iVar7;
  short *rows1p;
  void *pvVar8;
  short *rows1p_00;
  long lVar9;
  long lVar10;
  long lVar11;
  short *psVar12;
  int iVar13;
  int iVar14;
  short *rows0p;
  ulong uVar15;
  short *psVar16;
  short *rows0p_00;
  bool bVar17;
  uint uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  Mat local_c8;
  Mat local_78;
  
  uVar2 = (ulong)(uint)w;
  iVar7 = (h + w) * 2;
  uVar15 = 0xffffffffffffffff;
  if (-1 < iVar7) {
    uVar15 = (long)iVar7 * 4;
  }
  pvVar8 = operator_new__(uVar15);
  lVar10 = (long)w;
  lVar11 = (long)h;
  if (0 < w) {
    uVar15 = 0;
    do {
      fVar4 = ((float)(int)uVar15 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
      fVar19 = floorf(fVar4);
      iVar6 = (int)fVar19;
      fVar22 = 0.0;
      iVar7 = iVar6;
      if (iVar6 < 1) {
        iVar7 = 0;
      }
      if (-1 < iVar6) {
        fVar22 = (fVar4 - (float)(int)fVar19) * 2048.0;
      }
      iVar6 = iVar7;
      if (srcw + -1 <= iVar7) {
        iVar6 = srcw + -2;
      }
      *(int *)((long)pvVar8 + uVar15 * 4) = iVar6;
      if (srcw + -1 <= iVar7) {
        fVar22 = 2048.0;
      }
      uVar18 = -(uint)(0.0 <= 2048.0 - fVar22);
      auVar20._0_4_ = (int)((float)(uVar18 & 0x3f000000 | ~uVar18 & 0xbf000000) + (2048.0 - fVar22))
      ;
      auVar20._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar22) & 0x3f000000 | ~-(uint)(0.0 <= fVar22) & 0xbf000000)
                + fVar22);
      auVar20._8_8_ = 0;
      auVar20 = packssdw(auVar20,auVar20);
      *(int *)((long)pvVar8 + uVar15 * 4 + lVar11 * 4 + lVar10 * 4) = auVar20._0_4_;
      uVar15 = uVar15 + 1;
    } while (uVar2 != uVar15);
  }
  psVar12 = (short *)((long)pvVar8 + lVar11 * 4 + lVar10 * 8);
  if (0 < h) {
    uVar15 = 0;
    do {
      fVar4 = ((float)(int)uVar15 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
      fVar19 = floorf(fVar4);
      iVar7 = (int)fVar19;
      fVar22 = 0.0;
      bVar17 = -1 < iVar7;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (bVar17) {
        fVar22 = (fVar4 - (float)(int)fVar19) * 2048.0;
      }
      iVar6 = iVar7;
      if (srch + -1 <= iVar7) {
        iVar6 = srch + -2;
      }
      *(int *)((long)pvVar8 + uVar15 * 4 + lVar10 * 4) = iVar6;
      if (srch + -1 <= iVar7) {
        fVar22 = 2048.0;
      }
      uVar18 = -(uint)(0.0 <= 2048.0 - fVar22);
      auVar21._0_4_ = (int)((float)(uVar18 & 0x3f000000 | ~uVar18 & 0xbf000000) + (2048.0 - fVar22))
      ;
      auVar21._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar22) & 0x3f000000 | ~-(uint)(0.0 <= fVar22) & 0xbf000000)
                + fVar22);
      auVar21._8_8_ = 0;
      auVar20 = packssdw(auVar21,auVar21);
      *(int *)(psVar12 + uVar15 * 2) = auVar20._0_4_;
      uVar15 = uVar15 + 1;
    } while ((uint)h != uVar15);
  }
  local_c8.cstep = 0;
  local_c8.data = (short *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,w,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (short *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,w,2,(Allocator *)0x0);
  if (0 < h) {
    lVar11 = lVar11 * 4 + lVar10 * 4;
    iVar7 = 0;
    rows1p_00 = (short *)local_78.data;
    psVar16 = (short *)local_c8.data;
    iVar6 = -2;
    do {
      iVar1 = *(int *)((long)pvVar8 + (long)iVar7 * 4 + lVar10 * 4);
      psVar5 = rows1p_00;
      rows0p_00 = psVar16;
      if (iVar1 != iVar6) {
        if (iVar1 == iVar6 + 1) {
          psVar5 = psVar16;
          rows0p_00 = rows1p_00;
          if (0 < w) {
            iVar6 = (iVar1 + 1) * srcstride;
            uVar15 = 0;
            do {
              lVar9 = (long)*(int *)((long)pvVar8 + uVar15 * 4);
              psVar16[uVar15] =
                   (short)((uint)src[lVar9 + (long)iVar6 + 1] *
                           (int)*(short *)((long)pvVar8 + uVar15 * 4 + lVar11 + 2) +
                           (uint)src[lVar9 + iVar6] *
                           (int)*(short *)((long)pvVar8 + uVar15 * 4 + lVar11) >> 4);
              uVar15 = uVar15 + 1;
            } while (uVar2 != uVar15);
          }
        }
        else if (0 < w) {
          iVar6 = (iVar1 + 1) * srcstride;
          uVar15 = 0;
          do {
            lVar9 = (long)*(int *)((long)pvVar8 + uVar15 * 4);
            iVar13 = (int)*(short *)((long)pvVar8 + uVar15 * 4 + lVar11);
            iVar14 = (int)*(short *)((long)pvVar8 + uVar15 * 4 + lVar11 + 2);
            psVar16[uVar15] =
                 (short)((uint)src[lVar9 + (long)(iVar1 * srcstride) + 1] * iVar14 +
                         (uint)src[lVar9 + iVar1 * srcstride] * iVar13 >> 4);
            rows1p_00[uVar15] =
                 (short)((uint)src[lVar9 + (long)iVar6 + 1] * iVar14 +
                         (uint)src[lVar9 + iVar6] * iVar13 >> 4);
            uVar15 = uVar15 + 1;
          } while (uVar2 != uVar15);
        }
      }
      rows1p_00 = psVar5;
      iVar6 = iVar7 + 1;
      if ((iVar6 < h) && (*(int *)((long)pvVar8 + (long)iVar6 * 4 + lVar10 * 4) == iVar1)) {
        vresize_two(rows0p_00,rows1p_00,w,dst + iVar7 * stride,dst + iVar6 * stride,*psVar12,
                    psVar12[1],psVar12[2],psVar12[3]);
        lVar9 = 8;
        iVar7 = iVar6;
      }
      else {
        vresize_one(rows0p_00,rows1p_00,w,dst + iVar7 * stride,*psVar12,psVar12[1]);
        lVar9 = 4;
      }
      psVar12 = (short *)((long)psVar12 + lVar9);
      iVar7 = iVar7 + 1;
      psVar16 = rows0p_00;
      iVar6 = iVar1;
    } while (iVar7 < h);
  }
  operator_delete__(pvVar8);
  piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((short *)local_78.data != (short *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((short *)local_c8.data != (short *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_c1(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w, (size_t)2u);
    Mat rowsbuf1(w, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
                rows1p[dx] = (S1p[0] * a0 + S1p[1] * a1) >> 4;

                ialphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
                rows0p[dx] = (S0p[0] * a0 + S0p[1] * a1) >> 4;
                rows1p[dx] = (S1p[0] * a0 + S1p[1] * a1) >> 4;

                ialphap += 2;
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            unsigned char* Dp0 = dst + stride * dy;
            unsigned char* Dp1 = dst + stride * (dy + 1);

            vresize_two(rows0, rows1, w, Dp0, Dp1, ibeta[0], ibeta[1], ibeta[2], ibeta[3]);

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            unsigned char* Dp = dst + stride * dy;

            vresize_one(rows0, rows1, w, Dp, ibeta[0], ibeta[1]);

            ibeta += 2;
        }
    }

    delete[] buf;
}